

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O1

void __thiscall ParserTestComment::Run(ParserTestComment *this)

{
  Test *this_00;
  int iVar1;
  string local_68;
  string local_48;
  
  iVar1 = g_current_test->assertion_failures_;
  ParserTest::AssertParse(&this->super_ParserTest,"# this is a comment\nfoo = not # a comment\n");
  this_00 = g_current_test;
  if (iVar1 == g_current_test->assertion_failures_) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"foo","");
    BindingEnv::LookupVariable(&local_48,&(this->super_ParserTest).state.bindings_,&local_68);
    iVar1 = std::__cxx11::string::compare((char *)&local_48);
    testing::Test::Check
              (this_00,iVar1 == 0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/manifest_parser_test.cc"
               ,0xd8,"\"not # a comment\" == state.bindings_.LookupVariable(\"foo\")");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(ParserTest, Comment) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"# this is a comment\n"
"foo = not # a comment\n"));
  EXPECT_EQ("not # a comment", state.bindings_.LookupVariable("foo"));
}